

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.h
# Opt level: O0

void google::protobuf::Join<int_const*>(int *start,int *end,char *delim,string *result)

{
  AlphaNum *in_RCX;
  long in_RSI;
  long in_RDI;
  AlphaNum *in_stack_00000018;
  string *in_stack_00000020;
  int *it;
  int in_stack_ffffffffffffff9c;
  undefined8 local_28;
  
  for (local_28 = in_RDI; local_28 != in_RSI; local_28 = local_28 + 4) {
    if (local_28 != in_RDI) {
      std::__cxx11::string::append((char *)in_RCX);
    }
    strings::AlphaNum::AlphaNum(in_RCX,in_stack_ffffffffffffff9c);
    StrAppend(in_stack_00000020,in_stack_00000018);
  }
  return;
}

Assistant:

void Join(Iterator start, Iterator end,
          const char* delim, string* result) {
  for (Iterator it = start; it != end; ++it) {
    if (it != start) {
      result->append(delim);
    }
    StrAppend(result, *it);
  }
}